

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_x,float default_y)

{
  ImVec2 in_XMM0_Qa;
  float in_XMM1_Da;
  float in_XMM2_Da;
  ImVec2 content_max;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ImVec2 local_28;
  ImGuiContext *local_20;
  float local_18;
  float local_14;
  ImVec2 local_10;
  
  local_20 = GImGui;
  local_18 = in_XMM2_Da;
  local_14 = in_XMM1_Da;
  local_10 = in_XMM0_Qa;
  ImVec2::ImVec2(&local_28);
  if ((local_10.x < 0.0) || (local_10.y < 0.0)) {
    GetContentRegionMax();
    local_28 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (ImVec2 *)0x13daff);
  }
  if (local_10.x <= 0.0) {
    if ((local_10.x != 0.0) || (NAN(local_10.x))) {
      local_14 = ImMax<float>(local_28.x - (local_20->CurrentWindow->DC).CursorPos.x,4.0);
      local_14 = local_14 + local_10.x;
    }
    local_10.x = local_14;
  }
  if (local_10.y <= 0.0) {
    if ((local_10.y != 0.0) || (NAN(local_10.y))) {
      local_18 = ImMax<float>(local_28.y - (local_20->CurrentWindow->DC).CursorPos.y,4.0);
      local_18 = local_18 + local_10.y;
    }
    local_10.y = local_18;
  }
  return local_10;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_x, float default_y)
{
    ImGuiContext& g = *GImGui;
    ImVec2 content_max;
    if (size.x < 0.0f || size.y < 0.0f)
        content_max = g.CurrentWindow->Pos + GetContentRegionMax();
    if (size.x <= 0.0f)
        size.x = (size.x == 0.0f) ? default_x : ImMax(content_max.x - g.CurrentWindow->DC.CursorPos.x, 4.0f) + size.x;
    if (size.y <= 0.0f)
        size.y = (size.y == 0.0f) ? default_y : ImMax(content_max.y - g.CurrentWindow->DC.CursorPos.y, 4.0f) + size.y;
    return size;
}